

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::normalizeLineFeed(CScanner *this,char c)

{
  bool bVar1;
  char c_local;
  CScanner *this_local;
  
  if (c == '\r') {
    preprocessing(this,'\n');
    this->line = this->line + 1;
    this->position = 1;
  }
  else if (c == '\n') {
    if ((this->afterCarriageReturn & 1U) == 0) {
      preprocessing(this,'\n');
      this->line = this->line + 1;
      this->position = 1;
    }
  }
  else {
    bVar1 = IsControl(c);
    if (bVar1) {
      error(this,E_InvalidControlCharacter,c);
      this->position = this->position + 1;
    }
    else {
      preprocessing(this,c);
      this->position = this->position + 1;
      if (c == '\t') {
        while ((this->position + -1) % 8 != 0) {
          this->position = this->position + 1;
        }
      }
    }
  }
  this->afterCarriageReturn = c == '\r';
  return;
}

Assistant:

void CScanner::normalizeLineFeed( char c )
{
	if( c == CarriageReturn ) {
		preprocessing( LineFeed );
		line++;
		position = FirstCharacterNumber;
	} else if( c == LineFeed ) {
		if( !afterCarriageReturn ) {
			preprocessing( LineFeed );
			line++;
			position = FirstCharacterNumber;
		}
	} else if( IsControl( c ) ) {
		error( E_InvalidControlCharacter, c );
		position++;
	} else {
		preprocessing( c );
		position++;
		if( c == HorizontalTabulation ) {
			while( ( position - FirstCharacterNumber )
				% HorizontalTabulationSize != 0 )
			{
				position++;
			}
		}
	}
	afterCarriageReturn = ( c == CarriageReturn );
}